

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O1

bool __thiscall VanEmdeBoasTree::find(VanEmdeBoasTree *this,Node *root,int value)

{
  Node **ppNVar1;
  Node *pNVar2;
  double dVar3;
  
  while( true ) {
    if (root == (Node *)0x0) {
      return false;
    }
    if (value < 0) {
      return false;
    }
    if (((root->uni <= value) || (value < root->min)) || (root->max < value)) {
      return false;
    }
    if (root->min == value) {
      return true;
    }
    if (root->summary == (Node *)0x0) break;
    ppNVar1 = root->cluster;
    dVar3 = log2((double)root->uni);
    dVar3 = floor(dVar3 * 0.5);
    dVar3 = exp2(dVar3);
    pNVar2 = ppNVar1[(int)((float)value / (float)dVar3)];
    dVar3 = log2((double)root->uni);
    dVar3 = floor(dVar3 * 0.5);
    dVar3 = exp2(dVar3);
    value = value % (int)dVar3;
    root = pNVar2;
  }
  return root->max == value;
}

Assistant:

bool VanEmdeBoasTree::find(Node *root, int value) {
    if (!root) {
        return false;
    }

    if (value < 0 || value >= root->uni) {
        return false;
    }
    if (root->min > value || root->max < value) {
        return false;
    }
    if (root->min == value) {
        return true;
    }
    if (!root->summary) {
        return root->max == value;
    }
    return find(root->cluster[high(root, value)], low(root, value));
}